

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall ProxyListener::~ProxyListener(ProxyListener *this)

{
  ProxyListener *this_local;
  
  ~ProxyListener(this);
  operator_delete(this);
  return;
}

Assistant:

ProxyListener(const std::string &host, unsigned port)
            : host_(host), port_(port) {
        buffer_[0] = 0;
        if (host.length() > 0) {
            connect(host, port);
        }
    }